

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

void __thiscall
MemoryLeakDetector::checkForCorruption
          (MemoryLeakDetector *this,MemoryLeakDetectorNode *node,char *file,size_t line,
          TestMemoryAllocator *allocator,bool allocateNodesSeperately)

{
  long lVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  long *plVar5;
  undefined4 extraout_var;
  TestMemoryAllocator *freeAllocator;
  undefined4 extraout_var_01;
  size_t allocLine;
  char *allocFile;
  char *message;
  size_t allocSize;
  TestMemoryAllocator *allocAllocator;
  long *plVar6;
  undefined4 extraout_var_00;
  
  plVar5 = (long *)(**(code **)(**(long **)(node + 0x28) + 0x50))();
  iVar4 = (*allocator->_vptr_TestMemoryAllocator[10])(allocator);
  plVar6 = (long *)CONCAT44(extraout_var,iVar4);
  if (((plVar5 == plVar6) || (this->doAllocationTypeChecking_ != true)) ||
     (cVar3 = (**(code **)(*plVar6 + 0x38))(plVar6,plVar5), cVar3 != '\0')) {
    lVar1 = *(long *)node;
    lVar2 = *(long *)(node + 0x10);
    if (((*(char *)(lVar2 + lVar1) == 'B') && (*(char *)(lVar2 + 1 + lVar1) == 'A')) &&
       (*(char *)(lVar2 + 2 + lVar1) == 'S')) {
      if (!allocateNodesSeperately) {
        return;
      }
      (*allocator->_vptr_TestMemoryAllocator[9])(allocator,node);
      return;
    }
    iVar4 = (*allocator->_vptr_TestMemoryAllocator[10])(allocator);
    freeAllocator = (TestMemoryAllocator *)CONCAT44(extraout_var_00,iVar4);
    allocSize = *(size_t *)node;
    allocFile = *(char **)(node + 0x18);
    allocLine = *(size_t *)(node + 0x20);
    allocAllocator = *(TestMemoryAllocator **)(node + 0x28);
    message = "Memory corruption (written out of bounds?)\n";
  }
  else {
    iVar4 = (*allocator->_vptr_TestMemoryAllocator[10])(allocator);
    freeAllocator = (TestMemoryAllocator *)CONCAT44(extraout_var_01,iVar4);
    allocSize = *(size_t *)node;
    allocFile = *(char **)(node + 0x18);
    allocLine = *(size_t *)(node + 0x20);
    allocAllocator = *(TestMemoryAllocator **)(node + 0x28);
    message = "Allocation/deallocation type mismatch\n";
  }
  MemoryLeakOutputStringBuffer::reportFailure
            (&this->outputBuffer_,message,allocFile,allocLine,allocSize,allocAllocator,file,line,
             freeAllocator,this->reporter_);
  return;
}

Assistant:

void MemoryLeakDetector::checkForCorruption(MemoryLeakDetectorNode* node, const char* file, size_t line, TestMemoryAllocator* allocator, bool allocateNodesSeperately)
{
    if (!matchingAllocation(node->allocator_->actualAllocator(), allocator->actualAllocator()))
        outputBuffer_.reportAllocationDeallocationMismatchFailure(node, file, line, allocator->actualAllocator(), reporter_);
    else if (!validMemoryCorruptionInformation(node->memory_ + node->size_))
        outputBuffer_.reportMemoryCorruptionFailure(node, file, line, allocator->actualAllocator(), reporter_);
    else if (allocateNodesSeperately)
        allocator->freeMemoryLeakNode((char*) node);
}